

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# import.c
# Opt level: O2

void BinarySink_put_mp_ssh2_from_string(BinarySink *bs,ptrlen str)

{
  unsigned_long val;
  char *data;
  char *pcVar1;
  
  data = (char *)str.ptr;
  pcVar1 = data + str.len;
  val = str.len;
  do {
    if (val == 0) {
LAB_00114683:
      BinarySink_put_uint32(bs->binarysink_,val);
      data = pcVar1;
LAB_0011468f:
      BinarySink_put_data(bs->binarysink_,data,val);
      return;
    }
    if (*data != '\0') {
      pcVar1 = data;
      if (*data < '\0') {
        BinarySink_put_uint32(bs->binarysink_,val + 1);
        BinarySink_put_byte(bs->binarysink_,'\0');
        goto LAB_0011468f;
      }
      goto LAB_00114683;
    }
    data = data + 1;
    val = val - 1;
  } while( true );
}

Assistant:

void BinarySink_put_mp_ssh2_from_string(BinarySink *bs, ptrlen str)
{
    const unsigned char *bytes = (const unsigned char *)str.ptr;
    size_t nbytes = str.len;
    while (nbytes > 0 && bytes[0] == 0) {
        nbytes--;
        bytes++;
    }
    if (nbytes > 0 && bytes[0] & 0x80) {
        put_uint32(bs, nbytes + 1);
        put_byte(bs, 0);
    } else {
        put_uint32(bs, nbytes);
    }
    put_data(bs, bytes, nbytes);
}